

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

MultiIndexSet * __thiscall
TasGrid::GridLocalPolynomial::getRefinementCanidates<(TasGrid::RuleLocal::erule)4>
          (MultiIndexSet *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
          double *scale_correction)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  MultiIndexSet *pMVar5;
  bool local_c6;
  int local_c4;
  int j_1;
  int *map_1;
  int i_1;
  int j;
  int *map;
  int i;
  int num_points;
  undefined1 local_90 [8];
  Data2D<int> refined;
  undefined1 local_60 [7];
  bool useParents;
  Data2D<int> pmap;
  double *scale_correction_local;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  GridLocalPolynomial *this_local;
  MultiIndexSet *result;
  
  pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)scale_correction;
  buildUpdateMap<(TasGrid::RuleLocal::erule)4>
            ((Data2D<int> *)local_60,this,tolerance,criteria,output,scale_correction);
  local_c6 = criteria == refine_fds || criteria == refine_parents_first;
  refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = local_c6;
  Data2D<int>::Data2D<int,int>
            ((Data2D<int> *)local_90,(this->super_BaseCanonicalGrid).num_dimensions,0);
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)level_limits);
  if (bVar1) {
    for (map._4_4_ = 0; map._4_4_ < iVar2; map._4_4_ = map._4_4_ + 1) {
      piVar3 = Data2D<int>::getStrip((Data2D<int> *)local_60,map._4_4_);
      for (map_1._4_4_ = 0; map_1._4_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
          map_1._4_4_ = map_1._4_4_ + 1) {
        if (piVar3[map_1._4_4_] == 1) {
          if ((refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            pMVar5 = &(this->super_BaseCanonicalGrid).points;
            piVar4 = MultiIndexSet::getIndex(pMVar5,map._4_4_);
            bVar1 = addParent<(TasGrid::RuleLocal::erule)4>
                              (this,piVar4,map_1._4_4_,pMVar5,(Data2D<int> *)local_90);
            if (bVar1) goto LAB_0026ed2b;
          }
          pMVar5 = &(this->super_BaseCanonicalGrid).points;
          piVar4 = MultiIndexSet::getIndex(pMVar5,map._4_4_);
          addChild<(TasGrid::RuleLocal::erule)4>
                    (this,piVar4,map_1._4_4_,pMVar5,(Data2D<int> *)local_90);
        }
LAB_0026ed2b:
      }
    }
  }
  else {
    for (map_1._0_4_ = 0; (int)map_1 < iVar2; map_1._0_4_ = (int)map_1 + 1) {
      piVar3 = Data2D<int>::getStrip((Data2D<int> *)local_60,(int)map_1);
      for (local_c4 = 0; local_c4 < (this->super_BaseCanonicalGrid).num_dimensions;
          local_c4 = local_c4 + 1) {
        if (piVar3[local_c4] == 1) {
          if ((refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            pMVar5 = &(this->super_BaseCanonicalGrid).points;
            piVar4 = MultiIndexSet::getIndex(pMVar5,(int)map_1);
            bVar1 = addParent<(TasGrid::RuleLocal::erule)4>
                              (this,piVar4,local_c4,pMVar5,(Data2D<int> *)local_90);
            if (bVar1) goto LAB_0026ee6a;
          }
          pMVar5 = &(this->super_BaseCanonicalGrid).points;
          piVar4 = MultiIndexSet::getIndex(pMVar5,(int)map_1);
          addChildLimited<(TasGrid::RuleLocal::erule)4>
                    (this,piVar4,local_c4,pMVar5,level_limits,(Data2D<int> *)local_90);
        }
LAB_0026ee6a:
      }
    }
  }
  MultiIndexSet::MultiIndexSet(__return_storage_ptr__,(Data2D<int> *)local_90);
  if (criteria == refine_stable) {
    HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)4>
              (&(this->super_BaseCanonicalGrid).points,__return_storage_ptr__);
  }
  Data2D<int>::~Data2D((Data2D<int> *)local_90);
  Data2D<int>::~Data2D((Data2D<int> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridLocalPolynomial::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits, const double *scale_correction) const{
    Data2D<int> pmap = buildUpdateMap<effrule>(tolerance, criteria, output, scale_correction);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChild<effrule>(points.getIndex(i), j, points, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChild<effrule>(points.getIndex(i), j, points, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result(refined);
    if (criteria == refine_stable)
        HierarchyManipulations::completeToLower<effrule>(points, result);

    return result;
}